

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::convertToInteger
          (IEEEFloat *this,MutableArrayRef<unsigned_long> parts,uint width,bool isSigned,
          roundingMode rounding_mode,bool *isExact)

{
  opStatus oVar1;
  uint parts_00;
  size_t sVar2;
  unsigned_long *puVar3;
  uint local_44;
  uint dstPartsCount;
  uint bits;
  opStatus fs;
  roundingMode rounding_mode_local;
  bool isSigned_local;
  uint width_local;
  IEEEFloat *this_local;
  MutableArrayRef<unsigned_long> parts_local;
  
  parts_local.super_ArrayRef<unsigned_long>.Data =
       (unsigned_long *)parts.super_ArrayRef<unsigned_long>.Length;
  this_local = (IEEEFloat *)parts.super_ArrayRef<unsigned_long>.Data;
  oVar1 = convertToSignExtendedInteger(this,parts,width,isSigned,rounding_mode,isExact);
  if (oVar1 == opInvalidOp) {
    parts_00 = partCountForBits(width);
    sVar2 = ArrayRef<unsigned_long>::size((ArrayRef<unsigned_long> *)&this_local);
    if (sVar2 < parts_00) {
      __assert_fail("dstPartsCount <= parts.size() && \"Integer too big\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x872,
                    "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertToInteger(MutableArrayRef<integerPart>, unsigned int, bool, roundingMode, bool *) const"
                   );
    }
    if ((this->field_0x12 & 7) == 1) {
      local_44 = 0;
    }
    else if (((byte)this->field_0x12 >> 3 & 1) == 0) {
      local_44 = width - isSigned;
    }
    else {
      local_44 = (uint)isSigned;
    }
    puVar3 = MutableArrayRef<unsigned_long>::data((MutableArrayRef<unsigned_long> *)&this_local);
    APInt::tcSetLeastSignificantBits(puVar3,parts_00,local_44);
    if ((((byte)this->field_0x12 >> 3 & 1) != 0) && (isSigned)) {
      puVar3 = MutableArrayRef<unsigned_long>::data((MutableArrayRef<unsigned_long> *)&this_local);
      APInt::tcShiftLeft(puVar3,parts_00,width - 1);
    }
  }
  return oVar1;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertToInteger(MutableArrayRef<integerPart> parts,
                            unsigned int width, bool isSigned,
                            roundingMode rounding_mode, bool *isExact) const {
  opStatus fs;

  fs = convertToSignExtendedInteger(parts, width, isSigned, rounding_mode,
                                    isExact);

  if (fs == opInvalidOp) {
    unsigned int bits, dstPartsCount;

    dstPartsCount = partCountForBits(width);
    assert(dstPartsCount <= parts.size() && "Integer too big");

    if (category == fcNaN)
      bits = 0;
    else if (sign)
      bits = isSigned;
    else
      bits = width - isSigned;

    APInt::tcSetLeastSignificantBits(parts.data(), dstPartsCount, bits);
    if (sign && isSigned)
      APInt::tcShiftLeft(parts.data(), dstPartsCount, width - 1);
  }

  return fs;
}